

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O2

LispPTR COM_getfreeblock(LispPTR *args)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  LispPTR LVar4;
  char *lf_cp;
  LispPTR *pLVar5;
  long lVar6;
  char *host_00;
  int *piVar7;
  long lVar8;
  DLword *pDVar9;
  char ver [16];
  statvfs sfsbuf;
  char host [255];
  char name [256];
  char lfname [4101];
  char dir [4096];
  char file [4096];
  
  iVar3 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar3 == 0) {
    Lisp_errno = &Dummy_errno;
    pLVar5 = NativeAligned4FromLAddr(*args);
    if (*(char *)((long)pLVar5 + 6) == 'D') {
      LVar4 = pLVar5[2] * 2;
LAB_0011bcb1:
      if (0x1004 < (int)LVar4) {
        *Lisp_errno = 200;
        goto LAB_0011bc6b;
      }
    }
    else {
      if (*(char *)((long)pLVar5 + 6) == 'C') {
        LVar4 = pLVar5[2];
        goto LAB_0011bcb1;
      }
      error("LispStringLength: Not a character array.\n");
    }
    pLVar5 = NativeAligned4FromLAddr(*args);
    LVar4 = 0x1000;
    if ((int)pLVar5[2] < 0x1000) {
      LVar4 = pLVar5[2];
    }
    lVar6 = (long)(int)LVar4;
    if (*(char *)((long)pLVar5 + 6) == 'D') {
      pDVar9 = Lisp_world + (ulong)(ushort)pLVar5[1] + (ulong)(*pLVar5 & 0xfffffff);
      for (lVar8 = 0; lVar6 != lVar8; lVar8 = lVar8 + 1) {
        lfname[lVar8] = *(char *)((ulong)pDVar9 ^ 2);
        pDVar9 = pDVar9 + 1;
      }
      lfname[lVar8] = '\0';
    }
    else if (*(char *)((long)pLVar5 + 6) == 'C') {
      uVar2 = *pLVar5;
      LVar4 = pLVar5[1];
      for (lVar8 = 0; lVar6 != lVar8; lVar8 = lVar8 + 1) {
        lfname[lVar8] =
             *(char *)((long)Lisp_world +
                       lVar8 + (ulong)(ushort)LVar4 + (ulong)(uVar2 & 0xfffffff) * 2 ^ 3);
      }
      lfname[lVar6] = '\0';
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    pLVar5 = NativeAligned4FromLAddr(args[1]);
    host_00 = host;
    separate_host(lfname,host_00);
    for (; cVar1 = *host_00, cVar1 != '\0'; host_00 = host_00 + 1) {
      if ((byte)(cVar1 + 0x9fU) < 0x1a) {
        *host_00 = cVar1 + -0x20;
      }
    }
    if ((host._0_4_ != 0x4b5344) && (iVar3 = bcmp(host,"UNIX",5), iVar3 != 0)) {
      return 0;
    }
    LVar4 = 0;
    iVar3 = unixpathname(lfname,file,0,0);
    if (iVar3 != 0) {
      LVar4 = 0;
      iVar3 = unpack_filename(file,dir,name,ver,0);
      if (iVar3 != 0) {
        if ((host._0_4_ == 0x4b5344) && (iVar3 = true_name(dir), iVar3 != -1)) {
          return 0;
        }
        alarm(TIMEOUT_TIME);
        piVar7 = __errno_location();
        do {
          *piVar7 = 0;
          iVar3 = statvfs(dir,(statvfs *)&sfsbuf);
          if (iVar3 != -1) break;
        } while (*piVar7 == 4);
        LVar4 = 0;
        alarm(0);
        if (iVar3 == 0) {
          *pLVar5 = (LispPTR)sfsbuf.f_bavail;
          LVar4 = 0x4c;
        }
        else {
          *Lisp_errno = *piVar7;
        }
      }
    }
  }
  else {
    *Lisp_errno = 100;
LAB_0011bc6b:
    LVar4 = 0;
  }
  return LVar4;
}

Assistant:

LispPTR COM_getfreeblock(LispPTR *args)
{
  int dskp, rval, *buf;
  char lfname[MAXPATHLEN + 5], dir[MAXPATHLEN], host[MAXNAMLEN];
  char name[MAXNAMLEN + 1], file[MAXPATHLEN], ver[VERSIONLEN];
#ifdef DOS
  char drive[2];
  struct diskfree_t sfsbuf;
#else
  struct statvfs sfsbuf;
#endif

  ERRSETJMP(NIL);
  Lisp_errno = &Dummy_errno;

  LispStringLength(args[0], rval, dskp);
  /*
   * Add 1 byte for NULL terminating character.
   */
  rval += 1;
  /* Add 5 for the host name field in Lisp format. */
  if (rval > MAXPATHLEN + 5) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);
  buf = (int *)NativeAligned4FromLAddr(args[1]);
#ifdef DOS
  separate_host(lfname, host, drive);
#else
  separate_host(lfname, host);
#endif /* DOS */
  UPCASE(host);
  if (strcmp(host, "DSK") == 0)
    dskp = 1;
  else if (strcmp(host, "UNIX") == 0)
    dskp = 0;
  else
    return (NIL);

#ifdef DOS
  if (!unixpathname(lfname, file, 0, 0, drive, 0, 0)) return (NIL);
#else  /* DOS */
  if (!unixpathname(lfname, file, 0, 0)) return (NIL);
#endif /* DOS */

  if (!unpack_filename(file, dir, name, ver, 0)) return (NIL);

  if (dskp) {
    /*
     * Although Lisp code guarantees the directory is an existing one,
     * by calling DSK_getfilename, we check it again for safety.
     */
    if (true_name(dir) != -1) return (NIL);
  }

/*
 * The specified file itself might be a file being created newly.  Thus,
 * we check the available block size, using the directory on which the file
 * will be exist.
 */
#ifdef DOS
  /* For DOS, we have to use either the disk drive the file
     will be on, or the default drive. */

  if (drive[0]) {
    drive[1] = 0;
    UPCASE(drive);
    if (_dos_getdiskfree((unsigned)drive[0] - (int)'@', &sfsbuf))
      return (NIL); /* call failed, so name is invalid */

    *buf = sfsbuf.avail_clusters * sfsbuf.sectors_per_cluster * sfsbuf.bytes_per_sector;
  } else {
    if (_dos_getdiskfree(0, &sfsbuf)) return (NIL); /* call failed, so name is invalid */

    *buf = sfsbuf.avail_clusters * sfsbuf.sectors_per_cluster * sfsbuf.bytes_per_sector;
  }
#else
  TIMEOUT(rval = statvfs(dir, &sfsbuf));
  if (rval != 0) {
    *Lisp_errno = errno;
    return (NIL);
  }
  *buf = sfsbuf.f_bavail;
#endif /* DOS */
  return (ATOM_T);
}